

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_table_calculation.cpp
# Opt level: O2

void __thiscall
ParseTableCalculation::closeItemSet
          (ParseTableCalculation *this,
          set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>
          *set)

{
  _Rb_tree_header *__last;
  int iVar1;
  pointer pvVar2;
  int *piVar3;
  uint __line;
  pointer pIVar4;
  bool bVar5;
  iterator iVar6;
  iterator iVar7;
  _Rb_tree_node_base *p_Var8;
  pointer item_00;
  int *piVar9;
  char *__assertion;
  vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_> added_items;
  vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_> items;
  string right_of_dot;
  Item item;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  first_set;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  after_non_terminal_tokens;
  
  __last = &(set->_M_t)._M_impl.super__Rb_tree_header;
  std::vector<ParseTableCalculation::Item,std::allocator<ParseTableCalculation::Item>>::
  vector<std::_Rb_tree_const_iterator<ParseTableCalculation::Item>,void>
            ((vector<ParseTableCalculation::Item,std::allocator<ParseTableCalculation::Item>> *)
             &items,(set->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<ParseTableCalculation::Item>)__last,
             (allocator_type *)&first_set);
  do {
    pIVar4 = items.
             super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    added_items.
    super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    added_items.
    super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    added_items.
    super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (item_00 = items.
                   super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>
                   ._M_impl.super__Vector_impl_data._M_start; item_00 != pIVar4;
        item_00 = item_00 + 1) {
      rightOfDot_abi_cxx11_(&right_of_dot,this,item_00);
      if ((right_of_dot._M_string_length != 0) && (bVar5 = isTerminal(&right_of_dot), !bVar5)) {
        iVar6 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(this->non_terminal_to_rule_indices_)._M_h,&right_of_dot);
        if (iVar6.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          __assertion = "found != non_terminal_to_rule_indices_.end()";
          __line = 0x52;
LAB_0013dbc3:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/matej-svejda[P]script2000/src/parse_table_calculation.cpp"
                        ,__line,"void ParseTableCalculation::closeItemSet(std::set<Item> &)");
        }
        pvVar2 = (this->rules_).
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &after_non_terminal_tokens,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)item_00->dotPosition * 0x20 +
                    *(long *)&pvVar2[item_00->ruleIndex].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data + 0x20),
                   *(pointer *)
                    ((long)&pvVar2[item_00->ruleIndex].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data + 8),(allocator_type *)&first_set);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&after_non_terminal_tokens,&item_00->lookahead);
        getFirstSet(&first_set,this,&after_non_terminal_tokens);
        piVar3 = *(int **)((long)iVar6.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_true>
                                 ._M_cur + 0x30);
        for (piVar9 = *(int **)((long)iVar6.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_true>
                                      ._M_cur + 0x28); piVar9 != piVar3; piVar9 = piVar9 + 1) {
          iVar1 = *piVar9;
          p_Var8 = first_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          if ((int)(((long)(this->rules_).
                           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->rules_).
                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= iVar1) {
            __assertion = "rule_index < static_cast<int>(rules_.size())";
            __line = 0x59;
            goto LAB_0013dbc3;
          }
          for (; (_Rb_tree_header *)p_Var8 != &first_set._M_t._M_impl.super__Rb_tree_header;
              p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
            item.dotPosition = 1;
            item.ruleIndex = iVar1;
            std::__cxx11::string::string((string *)&item.lookahead,(string *)(p_Var8 + 1));
            iVar7 = std::
                    _Rb_tree<ParseTableCalculation::Item,_ParseTableCalculation::Item,_std::_Identity<ParseTableCalculation::Item>,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>
                    ::find(&set->_M_t,&item);
            if ((_Rb_tree_header *)iVar7._M_node == __last) {
              std::
              _Rb_tree<ParseTableCalculation::Item,ParseTableCalculation::Item,std::_Identity<ParseTableCalculation::Item>,std::less<ParseTableCalculation::Item>,std::allocator<ParseTableCalculation::Item>>
              ::_M_insert_unique<ParseTableCalculation::Item_const&>
                        ((_Rb_tree<ParseTableCalculation::Item,ParseTableCalculation::Item,std::_Identity<ParseTableCalculation::Item>,std::less<ParseTableCalculation::Item>,std::allocator<ParseTableCalculation::Item>>
                          *)set,&item);
              std::vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>
              ::push_back(&added_items,&item);
            }
            std::__cxx11::string::~string((string *)&item.lookahead);
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&first_set._M_t);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&after_non_terminal_tokens);
      }
      std::__cxx11::string::~string((string *)&right_of_dot);
    }
    if (added_items.
        super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        added_items.
        super__Vector_base<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>::
      ~vector(&added_items);
      std::vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>::
      ~vector(&items);
      return;
    }
    std::vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>::
    operator=(&items,&added_items);
    std::vector<ParseTableCalculation::Item,_std::allocator<ParseTableCalculation::Item>_>::~vector
              (&added_items);
  } while( true );
}

Assistant:

void ParseTableCalculation::closeItemSet(std::set<Item>& set)
{
	std::vector<Item> items(set.begin(), set.end());
	for (;;)
	{
		std::vector<Item> added_items;
		for (const Item& item : items)
		{
			std::string right_of_dot = rightOfDot(item);
			if (right_of_dot.empty() || isTerminal(right_of_dot))
			{
				continue;
			}
			auto found = non_terminal_to_rule_indices_.find(right_of_dot);
			assert(found != non_terminal_to_rule_indices_.end());
			const auto& rule = rules_[item.ruleIndex];
			std::vector<std::string> after_non_terminal_tokens(rule.begin() + item.dotPosition + 1, rule.end());
			after_non_terminal_tokens.push_back(item.lookahead);
			auto first_set = getFirstSet(after_non_terminal_tokens);
			for (int rule_index : found->second)
			{
				assert(rule_index < static_cast<int>(rules_.size()));
				for (const auto& token : first_set)
				{
					Item item(rule_index, 1, token);
					if (set.find(item) == set.end())
					{
						set.insert(item);
						added_items.push_back(item);
					}
				}
			}
		}
		if (added_items.empty())
		{
			return;
		}
		items = added_items;
	}
}